

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template-parser.c
# Opt level: O2

bc_slist_t * blogc_template_parse(char *src,size_t src_len,bc_error_t **err)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  _Bool _Var10;
  bool bVar11;
  char *pcVar12;
  bc_error_t *pbVar13;
  int iVar14;
  char *pcVar15;
  size_t current;
  uint uVar16;
  bool bVar17;
  size_t sStack_d0;
  int local_c4;
  ulong local_c0;
  ulong local_a8;
  ulong local_a0;
  size_t local_98;
  bc_slist_t *local_90;
  ulong local_80;
  ulong local_78;
  int *local_70;
  ulong local_68;
  size_t local_58;
  undefined8 local_48;
  
  if ((err != (bc_error_t **)0x0) && (*err == (bc_error_t *)0x0)) {
    local_c0 = 0;
    local_a8 = 0;
    local_98 = 0;
    local_a0 = 0;
    local_58 = 0;
    local_68 = 0;
    local_80 = 0;
    local_78 = 0;
    bVar11 = false;
    bVar4 = false;
    bVar5 = false;
    local_90 = (bc_slist_t *)0x0;
    local_70 = (int *)0x0;
    bVar3 = false;
    local_48 = 0;
    uVar16 = 1;
    local_c4 = 0xb;
    bVar6 = false;
    current = 0;
    do {
      if (src_len == current) {
        if (uVar16 == 0xd) {
          pbVar13 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,local_58,
                                    "Found an open double-quoted string.");
        }
        else if (local_80 == 0) {
          if (bVar6) {
            pcVar15 = "An open block was not closed!";
          }
          else {
            if (!bVar4) {
              return local_90;
            }
            pcVar15 = "An open \'foreach\' statement was not closed!";
          }
          pbVar13 = bc_error_new(BLOGC_ERROR_TEMPLATE_PARSER,pcVar15);
        }
        else {
          pbVar13 = bc_error_new_printf(BLOGC_ERROR_TEMPLATE_PARSER,
                                        "%d open \'if\', \'ifdef\' and/or \'ifndef\' statements were not closed!"
                                       );
        }
        *err = pbVar13;
        if (pbVar13 == (bc_error_t *)0x0) {
          return local_90;
        }
        break;
      }
      if (0x15 < uVar16 - 1) goto LAB_0010568f;
      cVar1 = src[current];
      iVar14 = (int)cVar1;
      sVar9 = local_a8;
      uVar7 = current;
      switch(uVar16) {
      case 1:
        if (src_len - 1 == current) {
          local_70 = (int *)bc_malloc(0x20);
          *local_70 = local_c4;
          pcVar15 = bc_strndup(src + local_c0,src_len - local_c0);
          if (bVar3) {
            pcVar12 = bc_str_lstrip(pcVar15);
            pcVar12 = bc_strdup(pcVar12);
            *(char **)(local_70 + 2) = pcVar12;
            free(pcVar15);
            bVar3 = false;
          }
          else {
            *(char **)(local_70 + 2) = pcVar15;
          }
          local_70[1] = 0;
          local_70[4] = 0;
          local_70[5] = 0;
          local_90 = bc_slist_append(local_90,local_70);
        }
        if (cVar1 == '{') {
          local_a8 = current;
        }
        uVar16 = (cVar1 == '{') + 1;
        break;
      case 2:
        uVar16 = 4;
        if (cVar1 != '%') {
          if (cVar1 != '{') {
            uVar16 = 1;
            break;
          }
          uVar16 = 0x13;
        }
        if (local_c0 <= local_a8 && local_a8 - local_c0 != 0) {
          local_70 = (int *)bc_malloc(0x20);
          *local_70 = local_c4;
          pcVar15 = bc_strndup(src + local_c0,local_a8 - local_c0);
          if (bVar3) {
            pcVar12 = bc_str_lstrip(pcVar15);
            pcVar12 = bc_strdup(pcVar12);
            *(char **)(local_70 + 2) = pcVar12;
            free(pcVar15);
            bVar3 = false;
          }
          else {
            *(char **)(local_70 + 2) = pcVar15;
          }
          local_70[1] = 0;
          local_70[4] = 0;
          local_70[5] = 0;
          local_90 = bc_slist_append(local_90,local_70);
        }
        break;
      case 3:
switchD_00104a2e_caseD_3:
        _Var10 = bc_isspace(iVar14);
        if (!_Var10) {
          if ((byte)(cVar1 + 0x9fU) < 0x1a) goto LAB_00105614;
          if (cVar1 == '-') {
            pcVar15 = "Invalid statement syntax. Duplicated whitespace cleaner before statement.";
          }
          else {
            pcVar15 = "Invalid statement syntax. Must begin with lowercase letter.";
          }
          pbVar13 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,current,pcVar15);
          *err = pbVar13;
        }
        goto LAB_00105147;
      case 4:
        if (cVar1 != '-') goto switchD_00104a2e_caseD_3;
        if (local_70 == (int *)0x0) {
          local_70 = (int *)0x0;
        }
        else if (*local_70 == 0xb) {
          pcVar15 = bc_str_rstrip(*(char **)(local_70 + 2));
          *(char **)(local_70 + 2) = pcVar15;
        }
LAB_00105147:
        uVar16 = 3;
        break;
      case 5:
        uVar7 = local_c0;
        if (0x19 < (byte)(cVar1 + 0x9fU)) {
          _Var10 = bc_isspace(iVar14);
          if (_Var10) {
            switch(current - local_c0) {
            case 2:
              if ((byte)src[local_c0] - 0x69 == 0) {
                iVar14 = 0x66 - (uint)(byte)src[local_c0 + 1];
              }
              else {
                iVar14 = -((byte)src[local_c0] - 0x69);
              }
              if (iVar14 != 0) goto switchD_00104b4c_caseD_3;
              local_80 = local_80 + 1;
              bVar11 = false;
              uVar16 = 8;
              local_c4 = 3;
              local_c0 = current;
              break;
            default:
              goto switchD_00104b4c_caseD_3;
            case 4:
              iVar14 = strncmp("else",src + local_c0,4);
              if (iVar14 != 0) goto switchD_00104b4c_caseD_3;
              bVar17 = local_80 == 0;
              if (bVar6) {
                bVar17 = local_80 <= local_78;
              }
              if (!bVar17) {
                if (bVar11) {
                  pbVar13 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,current,
                                            "More than one \'else\' statement for an open \'if\', \'ifdef\' or \'ifndef\' statement."
                                           );
                  *err = pbVar13;
                  bVar11 = true;
                  goto LAB_00105614;
                }
                bVar11 = true;
                uVar16 = 0x11;
                local_c4 = 4;
                break;
              }
              pcVar15 = 
              "\'else\' statement without an open \'if\', \'ifdef\' or \'ifndef\' statement.";
              goto LAB_0010560a;
            case 5:
              pcVar15 = src + local_c0;
              iVar14 = strncmp("block",pcVar15,5);
              if (iVar14 == 0) {
                if (bVar6) {
                  pcVar15 = "Blocks can\'t be nested.";
                  goto LAB_0010560a;
                }
                local_78 = local_80;
                uVar16 = 6;
                local_c4 = 8;
                local_c0 = current;
                bVar5 = bVar4;
              }
              else {
                iVar14 = strncmp("ifdef",pcVar15,5);
                if (iVar14 == 0) {
                  local_80 = local_80 + 1;
                  bVar11 = false;
                  uVar16 = 8;
                  local_c4 = 1;
                  local_c0 = current;
                }
                else {
                  iVar14 = strncmp("endif",pcVar15,5);
                  if (iVar14 != 0) goto switchD_00104b4c_caseD_3;
                  bVar17 = local_80 == 0;
                  if (bVar6) {
                    bVar17 = local_80 <= local_78;
                  }
                  if (bVar17) {
                    pcVar15 = 
                    "\'endif\' statement without an open \'if\', \'ifdef\' or \'ifndef\' statement."
                    ;
                    goto LAB_0010560a;
                  }
                  local_80 = local_80 - 1;
                  bVar11 = false;
                  uVar16 = 0x11;
                  local_c4 = 5;
                }
              }
              break;
            case 6:
              iVar14 = strncmp("ifndef",src + local_c0,6);
              if (iVar14 != 0) goto switchD_00104b4c_caseD_3;
              local_80 = local_80 + 1;
              bVar11 = false;
              uVar16 = 8;
              local_c4 = 2;
              local_c0 = current;
              break;
            case 7:
              iVar14 = strncmp("foreach",src + local_c0,7);
              if (iVar14 != 0) goto switchD_00104b4c_caseD_3;
              if (bVar4) {
                pcVar15 = "\'foreach\' statements can\'t be nested.";
                goto LAB_0010560a;
              }
              bVar4 = true;
              uVar16 = 0xf;
              local_c4 = 6;
              local_c0 = current;
              break;
            case 8:
              iVar14 = strncmp("endblock",src + local_c0,8);
              if (iVar14 != 0) goto switchD_00104b4c_caseD_3;
              if (!bVar6) {
                pcVar15 = "\'endblock\' statement without an open \'block\' statement.";
                goto LAB_0010560a;
              }
              if (local_80 - local_78 == 0) {
                if ((!bVar5) && (bVar4)) {
                  pbVar13 = bc_error_new_printf(BLOGC_ERROR_TEMPLATE_PARSER,
                                                "An open \'foreach\' statement was not closed inside a \'%s\' block!"
                                                ,local_48);
                  *err = pbVar13;
                  local_78 = local_80;
                  goto LAB_00105614;
                }
                bVar6 = false;
                uVar16 = 0x11;
                local_c4 = 9;
                local_78 = local_80;
                break;
              }
              pbVar13 = bc_error_new_printf(BLOGC_ERROR_TEMPLATE_PARSER,
                                            "%d open \'if\', \'ifdef\' and/or \'ifndef\' statements were not closed inside a \'%s\' block!"
                                            ,local_80 - local_78,local_48);
              goto LAB_00105611;
            case 10:
              iVar14 = strncmp("endforeach",src + local_c0,10);
              if (iVar14 != 0) goto switchD_00104b4c_caseD_3;
              if (((bVar6) && (bVar5)) || (!bVar4)) {
                pcVar15 = "\'endforeach\' statement without an open \'foreach\' statement.";
                goto LAB_0010560a;
              }
              bVar4 = false;
              uVar16 = 0x11;
              local_c4 = 7;
            }
            break;
          }
switchD_00104b4c_caseD_3:
          pcVar15 = 
          "Invalid statement type: Allowed types are: \'block\', \'endblock\', \'if\', \'ifdef\', \'ifndef\', \'else\', \'endif\', \'foreach\' and \'endforeach\'."
          ;
LAB_0010560a:
          pbVar13 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,current,pcVar15);
LAB_00105611:
          *err = pbVar13;
        }
LAB_00105614:
        local_c0 = uVar7;
        uVar16 = 5;
        break;
      case 6:
        _Var10 = bc_isspace(iVar14);
        if (!_Var10) {
          uVar8 = current;
          if ((byte)(cVar1 + 0x9fU) < 0x1a) goto LAB_001052a4;
          pbVar13 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,current,
                                    "Invalid block syntax. Must begin with lowercase letter.");
          *err = pbVar13;
        }
        uVar16 = 6;
        break;
      case 7:
        uVar8 = local_c0;
        if (cVar1 != '_' && 0x19 < (byte)(cVar1 + 0x9fU)) {
          _Var10 = bc_isspace(iVar14);
          if (_Var10) {
            switch(current - local_c0) {
            case 5:
              pcVar15 = "entry";
              sStack_d0 = 5;
              break;
            default:
              goto switchD_00104ead_caseD_6;
            case 7:
              pcVar15 = "listing";
              sStack_d0 = 7;
              break;
            case 0xc:
              pcVar15 = "listing_once";
              sStack_d0 = 0xc;
              break;
            case 0xd:
              iVar14 = strncmp("listing_empty",src + local_c0,0xd);
              if (iVar14 == 0) {
                bVar6 = true;
                local_a8 = current;
                uVar16 = 0x11;
              }
              else {
                iVar14 = strncmp("listing_entry",src + local_c0,0xd);
                if (iVar14 != 0) goto switchD_00104ead_caseD_6;
                bVar6 = true;
                local_a8 = current;
                uVar16 = 0x11;
              }
              goto LAB_0010568f;
            }
            iVar14 = strncmp(pcVar15,src + local_c0,sStack_d0);
            if (iVar14 == 0) {
              bVar6 = true;
              goto LAB_001052b6;
            }
          }
switchD_00104ead_caseD_6:
          pbVar13 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,current,
                                    "Invalid block type. Allowed types are: \'entry\', \'listing\', \'listing_once\', \'listing_empty\' and \'listing_entry\'."
                                   );
          *err = pbVar13;
        }
LAB_001052a4:
        local_c0 = uVar8;
        uVar16 = 7;
        break;
      case 8:
        _Var10 = bc_isspace(iVar14);
        if (!_Var10) {
          if ((byte)(cVar1 + 0xbfU) < 0x1a) goto LAB_001051d8;
          pbVar13 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,current,
                                    "Invalid variable name. Must begin with uppercase letter.");
          *err = pbVar13;
        }
        uVar16 = 8;
        break;
      case 9:
        uVar7 = local_c0;
        if ((0x19 < (byte)(cVar1 + 0xbfU)) && (cVar1 != '_' && 9 < (byte)(cVar1 - 0x30U))) {
          _Var10 = bc_isspace(iVar14);
          if (_Var10) {
            local_a8 = current;
            uVar16 = 0x11;
            if (local_c4 == 3) {
              uVar16 = 10;
            }
            break;
          }
          pbVar13 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,current,
                                    "Invalid variable name. Must be uppercase letter, number or \'_\'."
                                   );
          *err = pbVar13;
        }
LAB_001051d8:
        local_c0 = uVar7;
        uVar16 = 9;
        break;
      case 10:
        _Var10 = bc_isspace(iVar14);
        if (!_Var10) {
          local_98 = current;
        }
        uVar16 = _Var10 ^ 0xb;
        break;
      case 0xb:
        _Var10 = bc_isspace(iVar14);
        if (_Var10) {
          local_a0 = current;
        }
        uVar16 = _Var10 + 0xb;
        break;
      case 0xc:
        _Var10 = bc_isspace(iVar14);
        if (!_Var10) {
          sVar9 = current;
          if ((byte)(cVar1 + 0xbfU) < 0x1a) goto LAB_00104f99;
          if (cVar1 == '\"') goto LAB_0010504f;
          pbVar13 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,current,
                                    "Invalid \'if\' operand. Must be double-quoted static string or variable."
                                   );
          *err = pbVar13;
          local_98 = 0;
          local_a0 = 0;
        }
        uVar16 = 0xc;
        break;
      case 0xd:
        sVar9 = local_58;
        if (cVar1 == '\"') {
          if (src[current - 1] != '\\') {
            local_68 = current + 1;
          }
          uVar16 = (uint)(src[current - 1] != '\\') * 4 + 0xd;
        }
        else {
LAB_0010504f:
          local_58 = sVar9;
          uVar16 = 0xd;
        }
        break;
      case 0xe:
        sVar9 = local_58;
        if ((byte)(cVar1 + 0xbfU) < 0x1a) {
LAB_00104f99:
          local_58 = sVar9;
          uVar16 = 0xe;
        }
        else {
          bVar17 = 9 < (byte)(cVar1 - 0x30U);
          if (cVar1 != '_' && bVar17) {
            local_68 = current;
          }
          bVar17 = cVar1 != '_' && bVar17;
          uVar16 = (uint)bVar17 + (uint)bVar17 * 2 + 0xe;
        }
        break;
      case 0xf:
        _Var10 = bc_isspace(iVar14);
        if (!_Var10) {
          uVar8 = current;
          if ((byte)(cVar1 + 0xbfU) < 0x1a) goto LAB_00104c11;
          pbVar13 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,current,
                                    "Invalid foreach variable name. Must begin with uppercase letter."
                                   );
          *err = pbVar13;
        }
        uVar16 = 0xf;
        break;
      case 0x10:
        uVar8 = local_c0;
        if ((0x19 < (byte)(cVar1 + 0xbfU)) && (cVar1 != '_' && 9 < (byte)(cVar1 - 0x30U))) {
          _Var10 = bc_isspace(iVar14);
          if (_Var10) goto LAB_001052b6;
          pbVar13 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,current,
                                    "Invalid foreach variable name. Must be uppercase letter, number or \'_\'."
                                   );
          *err = pbVar13;
        }
LAB_00104c11:
        local_c0 = uVar8;
        uVar16 = 0x10;
        break;
      case 0x11:
        _Var10 = bc_isspace(iVar14);
        uVar7 = local_a8;
        if (!_Var10) {
          if (cVar1 == '%') goto LAB_00105689;
          if (cVar1 != '-') goto LAB_00104d4b;
          bVar3 = true;
          goto LAB_0010500e;
        }
LAB_001052b6:
        local_a8 = uVar7;
        uVar16 = 0x11;
        break;
      case 0x12:
        if (cVar1 == '-') {
          pcVar15 = "Invalid statement syntax. Duplicated whitespace cleaner after statement.";
        }
        else {
          if (cVar1 == '%') goto LAB_00105689;
LAB_00104d4b:
          pcVar15 = "Invalid statement syntax. Must end with \'%%}\'.";
        }
        pbVar13 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,current,pcVar15);
        *err = pbVar13;
LAB_0010500e:
        uVar16 = 0x12;
        break;
      case 0x13:
        _Var10 = bc_isspace(iVar14);
        if (!_Var10) {
          if ((byte)(cVar1 + 0xbfU) < 0x1a) {
            uVar16 = 0x14;
            local_c4 = 10;
            local_c0 = current;
            break;
          }
          pbVar13 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,current,
                                    "Invalid variable name. Must begin with uppercase letter.");
          *err = pbVar13;
        }
        uVar16 = 0x13;
        break;
      case 0x14:
        if ((0x19 < (byte)(cVar1 + 0xbfU)) && (cVar1 != '_' && 9 < (byte)(cVar1 - 0x30U))) {
          _Var10 = bc_isspace(iVar14);
          if (_Var10) goto LAB_00105124;
          sVar9 = current;
          if (cVar1 == '}') goto LAB_00105689;
          pbVar13 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,current,
                                    "Invalid variable name. Must be uppercase letter, number or \'_\'."
                                   );
          *err = pbVar13;
        }
        uVar16 = 0x14;
        break;
      case 0x15:
        _Var10 = bc_isspace(iVar14);
        uVar7 = local_a8;
        if (!_Var10) {
          if (cVar1 == '}') goto LAB_00105689;
          pbVar13 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,current,
                                    "Invalid statement syntax. Must end with \'}}\'.");
          *err = pbVar13;
        }
LAB_00105124:
        local_a8 = uVar7;
        uVar16 = 0x15;
        break;
      case 0x16:
        if (cVar1 == '}') {
          iVar14 = 0;
          if (local_98 < local_a0) {
            if (local_a0 - local_98 == 2) {
              bVar2 = src[local_98];
              if (bVar2 == 0x3e) {
                if (src[local_98 + 1] != '=') goto LAB_0010565d;
                iVar14 = 10;
              }
              else if (bVar2 == 0x3d) {
                if (src[local_98 + 1] != '=') goto LAB_0010565d;
                iVar14 = 2;
              }
              else if (bVar2 == 0x3c) {
                if (src[local_98 + 1] != '=') goto LAB_0010565d;
                iVar14 = 6;
              }
              else {
                iVar14 = bVar2 - 0x21;
                if (iVar14 == 0) {
                  iVar14 = 0x3d - (uint)(byte)src[local_98 + 1];
                }
                else {
                  iVar14 = -iVar14;
                }
                if (iVar14 != 0) goto LAB_0010565d;
                iVar14 = 1;
              }
            }
            else {
              if (local_a0 - local_98 != 1) {
LAB_0010565d:
                pbVar13 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,local_98,
                                          "Invalid \'if\' operator. Must be \'<\', \'>\', \'<=\', \'>=\', \'==\' or \'!=\'."
                                         );
                *err = pbVar13;
                local_98 = 0;
                local_a0 = 0;
                goto LAB_00105689;
              }
              if (src[local_98] == '<') {
                iVar14 = 4;
              }
              else {
                if (src[local_98] != '>') goto LAB_0010565d;
                iVar14 = 8;
              }
            }
            local_98 = 0;
            local_a0 = 0;
          }
          local_70 = (int *)bc_malloc(0x20);
          *local_70 = local_c4;
          local_70[1] = iVar14;
          local_70[2] = 0;
          local_70[3] = 0;
          local_70[4] = 0;
          local_70[5] = 0;
          if (local_c0 <= local_a8 && local_a8 - local_c0 != 0) {
            pcVar15 = bc_strndup(src + local_c0,local_a8 - local_c0);
            *(char **)(local_70 + 2) = pcVar15;
          }
          if (local_58 <= local_68 && local_68 - local_58 != 0) {
            pcVar15 = bc_strndup(src + local_58,local_68 - local_58);
            *(char **)(local_70 + 4) = pcVar15;
            local_58 = 0;
            local_68 = 0;
          }
          if (local_c4 == 8) {
            local_48 = *(undefined8 *)(local_70 + 2);
          }
          local_90 = bc_slist_append(local_90,local_70);
          uVar16 = 1;
          local_c4 = 0xb;
          local_c0 = current + 1;
        }
        else {
          pbVar13 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,current,
                                    "Invalid statement syntax. Must end with \'}\'.");
          *err = pbVar13;
LAB_00105689:
          local_a8 = sVar9;
          uVar16 = 0x16;
        }
      }
LAB_0010568f:
      current = current + 1;
    } while (*err == (bc_error_t *)0x0);
    blogc_template_free_ast(local_90);
  }
  return (bc_slist_t *)0x0;
}

Assistant:

bc_slist_t*
blogc_template_parse(const char *src, size_t src_len, bc_error_t **err)
{
    if (err == NULL || *err != NULL)
        return NULL;

    size_t current = 0;
    size_t start = 0;
    size_t end = 0;
    size_t op_start = 0;
    size_t op_end = 0;
    size_t start2 = 0;
    size_t end2 = 0;

    blogc_template_operator_t tmp_op = 0;

    size_t if_count = 0;
    size_t block_if_count = 0;
    bool else_open = false;
    bool foreach_open = false;
    bool block_foreach_open = false;

    bc_slist_t *ast = NULL;
    blogc_template_node_t *node = NULL;

    /*
     * this is a reference to the content of previous node in the singly-linked
     * list. The "correct" solution here would be implement a doubly-linked
     * list, but here are a few reasons to avoid it:
     *
     * - i'm too tired to implement it :P
     * - template parser never walk backwards, then the list itself does not
     *   need to know its previous node.
     */
    blogc_template_node_t *previous = NULL;

    bool lstrip_next = false;
    char *tmp = NULL;
    char *block_type = NULL;

    blogc_template_parser_state_t state = TEMPLATE_START;
    blogc_template_node_type_t type = BLOGC_TEMPLATE_NODE_CONTENT;

    bool block_open = false;

    while (current < src_len) {
        char c = src[current];
        bool last = current == src_len - 1;

        switch (state) {

            case TEMPLATE_START:
                if (last) {
                    node = bc_malloc(sizeof(blogc_template_node_t));
                    node->type = type;
                    if (lstrip_next) {
                        tmp = bc_strndup(src + start, src_len - start);
                        node->data[0] = bc_strdup(bc_str_lstrip(tmp));
                        free(tmp);
                        tmp = NULL;
                        lstrip_next = false;
                    }
                    else {
                        node->data[0] = bc_strndup(src + start, src_len - start);
                    }
                    node->op = 0;
                    node->data[1] = NULL;
                    ast = bc_slist_append(ast, node);
                    previous = node;
                    node = NULL;
                }
                if (c == '{') {
                    end = current;
                    state = TEMPLATE_OPEN_BRACKET;
                }
                break;

            case TEMPLATE_OPEN_BRACKET:
                if (c == '%' || c == '{') {
                    if (c == '%')
                        state = TEMPLATE_BLOCK_START_WHITESPACE_CLEANER;
                    else
                        state = TEMPLATE_VARIABLE_START;
                    if (end > start) {
                        node = bc_malloc(sizeof(blogc_template_node_t));
                        node->type = type;
                        if (lstrip_next) {
                            tmp = bc_strndup(src + start, end - start);
                            node->data[0] = bc_strdup(bc_str_lstrip(tmp));
                            free(tmp);
                            tmp = NULL;
                            lstrip_next = false;
                        }
                        else {
                            node->data[0] = bc_strndup(src + start, end - start);
                        }
                        node->op = 0;
                        node->data[1] = NULL;
                        ast = bc_slist_append(ast, node);
                        previous = node;
                        node = NULL;
                    }
                    break;
                }
                state = TEMPLATE_START;
                break;

            case TEMPLATE_BLOCK_START_WHITESPACE_CLEANER:
                if (c == '-') {
                    if ((previous != NULL) &&
                        (previous->type == BLOGC_TEMPLATE_NODE_CONTENT))
                    {
                        previous->data[0] = bc_str_rstrip(previous->data[0]);  // does not need copy
                    }
                    state = TEMPLATE_BLOCK_START;
                    break;
                }
                state = TEMPLATE_BLOCK_START;

            case TEMPLATE_BLOCK_START:
                if (bc_isspace(c))
                    break;
                if (c >= 'a' && c <= 'z') {
                    state = TEMPLATE_BLOCK_TYPE;
                    start = current;
                    break;
                }
                if (c == '-') {
                    *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                        src_len, current,
                        "Invalid statement syntax. Duplicated whitespace "
                        "cleaner before statement.");
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid statement syntax. Must begin with lowercase letter.");
                break;

            case TEMPLATE_BLOCK_TYPE:
                if (c >= 'a' && c <= 'z')
                    break;
                if (bc_isspace(c)) {
                    if ((current - start == 5) &&
                        (0 == strncmp("block", src + start, 5)))
                    {
                        if (!block_open) {
                            state = TEMPLATE_BLOCK_BLOCK_TYPE_START;
                            type = BLOGC_TEMPLATE_NODE_BLOCK;
                            start = current;
                            block_if_count = if_count;
                            block_foreach_open = foreach_open;
                            break;
                        }
                        *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,
                            src, src_len, current, "Blocks can't be nested.");
                        break;
                    }
                    else if ((current - start == 8) &&
                        (0 == strncmp("endblock", src + start, 8)))
                    {
                        if (block_open) {
                            if (if_count != block_if_count) {
                                *err = bc_error_new_printf(BLOGC_ERROR_TEMPLATE_PARSER,
                                    "%d open 'if', 'ifdef' and/or 'ifndef' statements "
                                    "were not closed inside a '%s' block!",
                                    if_count - block_if_count, block_type);
                                break;
                            }
                            if (!block_foreach_open && foreach_open) {
                                *err = bc_error_new_printf(BLOGC_ERROR_TEMPLATE_PARSER,
                                    "An open 'foreach' statement was not closed "
                                    "inside a '%s' block!", block_type);
                                break;
                            }
                            state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                            type = BLOGC_TEMPLATE_NODE_ENDBLOCK;
                            block_open = false;
                            break;
                        }
                        *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,
                            src, src_len, current,
                            "'endblock' statement without an open 'block' statement.");
                        break;
                    }
                    else if ((current - start == 5) &&
                        (0 == strncmp("ifdef", src + start, 5)))
                    {
                        state = TEMPLATE_BLOCK_IF_START;
                        type = BLOGC_TEMPLATE_NODE_IFDEF;
                        start = current;
                        if_count++;
                        else_open = false;
                        break;
                    }
                    else if ((current - start == 6) &&
                        (0 == strncmp("ifndef", src + start, 6)))
                    {
                        state = TEMPLATE_BLOCK_IF_START;
                        type = BLOGC_TEMPLATE_NODE_IFNDEF;
                        start = current;
                        if_count++;
                        else_open = false;
                        break;
                    }
                    else if ((current - start == 2) &&
                        (0 == strncmp("if", src + start, 2)))
                    {
                        state = TEMPLATE_BLOCK_IF_START;
                        type = BLOGC_TEMPLATE_NODE_IF;
                        start = current;
                        if_count++;
                        else_open = false;
                        break;
                    }
                    else if ((current - start == 4) &&
                        (0 == strncmp("else", src + start, 4)))
                    {
                        if ((block_open && if_count > block_if_count) ||
                            (!block_open && if_count > 0))
                        {
                            if (!else_open) {
                                state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                                type = BLOGC_TEMPLATE_NODE_ELSE;
                                else_open = true;
                                break;
                            }
                            *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,
                                src, src_len, current,
                                "More than one 'else' statement for an open 'if', "
                                "'ifdef' or 'ifndef' statement.");
                            break;
                        }
                        *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,
                            src, src_len, current,
                            "'else' statement without an open 'if', 'ifdef' or "
                            "'ifndef' statement.");
                        break;
                    }
                    else if ((current - start == 5) &&
                        (0 == strncmp("endif", src + start, 5)))
                    {
                        if ((block_open && if_count > block_if_count) ||
                            (!block_open && if_count > 0))
                        {
                            state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                            type = BLOGC_TEMPLATE_NODE_ENDIF;
                            if_count--;
                            else_open = false;
                            break;
                        }
                        *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,
                            src, src_len, current,
                            "'endif' statement without an open 'if', 'ifdef' or "
                            "'ifndef' statement.");
                        break;
                    }
                    else if ((current - start == 7) &&
                        (0 == strncmp("foreach", src + start, 7)))
                    {
                        if (!foreach_open) {
                            state = TEMPLATE_BLOCK_FOREACH_START;
                            type = BLOGC_TEMPLATE_NODE_FOREACH;
                            start = current;
                            foreach_open = true;
                            break;
                        }
                        *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,
                            src, src_len, current, "'foreach' statements can't "
                            "be nested.");
                        break;
                    }
                    else if ((current - start == 10) &&
                        (0 == strncmp("endforeach", src + start, 10)))
                    {
                        if ((block_open && !block_foreach_open && foreach_open) ||
                            (!block_open && foreach_open))
                        {
                            state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                            type = BLOGC_TEMPLATE_NODE_ENDFOREACH;
                            foreach_open = false;
                            break;
                        }
                        *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,
                            src, src_len, current,
                            "'endforeach' statement without an open 'foreach' "
                            "statement.");
                        break;
                    }
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid statement type: Allowed types are: 'block', "
                    "'endblock', 'if', 'ifdef', 'ifndef', 'else', 'endif', "
                    "'foreach' and 'endforeach'.");
                break;

            case TEMPLATE_BLOCK_BLOCK_TYPE_START:
                if (bc_isspace(c))
                    break;
                if (c >= 'a' && c <= 'z') {
                    state = TEMPLATE_BLOCK_BLOCK_TYPE;
                    start = current;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid block syntax. Must begin with lowercase letter.");
                break;

            case TEMPLATE_BLOCK_BLOCK_TYPE:
                if ((c >= 'a' && c <= 'z') || c == '_')
                    break;
                if (bc_isspace(c)) {
                    if ((current - start == 5) &&
                        (0 == strncmp("entry", src + start, 5)))
                    {
                        block_open = true;
                        end = current;
                        state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                        break;
                    }
                    else if ((current - start == 7) &&
                        (0 == strncmp("listing", src + start, 7)))
                    {
                        block_open = true;
                        end = current;
                        state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                        break;
                    }
                    else if ((current - start == 12) &&
                        (0 == strncmp("listing_once", src + start, 12)))
                    {
                        block_open = true;
                        end = current;
                        state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                        break;
                    }
                    else if ((current - start == 13) &&
                        (0 == strncmp("listing_empty", src + start, 13)))
                    {
                        block_open = true;
                        end = current;
                        state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                        break;
                    }
                    else if ((current - start == 13) &&
                        (0 == strncmp("listing_entry", src + start, 13)))
                    {
                        block_open = true;
                        end = current;
                        state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                        break;
                    }
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid block type. Allowed types are: 'entry', 'listing', "
                    "'listing_once', 'listing_empty' and 'listing_entry'.");
                break;

            case TEMPLATE_BLOCK_IF_START:
                if (bc_isspace(c))
                    break;
                if (c >= 'A' && c <= 'Z') {
                    state = TEMPLATE_BLOCK_IF_VARIABLE;
                    start = current;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid variable name. Must begin with uppercase letter.");
                break;

            case TEMPLATE_BLOCK_IF_VARIABLE:
                if ((c >= 'A' && c <= 'Z') || (c >= '0' && c <= '9') || c == '_')
                    break;
                if (bc_isspace(c)) {
                    end = current;
                    if (type == BLOGC_TEMPLATE_NODE_IF)
                        state = TEMPLATE_BLOCK_IF_OPERATOR_START;
                    else
                        state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid variable name. Must be uppercase letter, number "
                    "or '_'.");
                break;

            case TEMPLATE_BLOCK_IF_OPERATOR_START:
                if (bc_isspace(c))
                    break;
                state = TEMPLATE_BLOCK_IF_OPERATOR;
                op_start = current;
                break;

            case TEMPLATE_BLOCK_IF_OPERATOR:
                if (!bc_isspace(c))
                    break;
                state = TEMPLATE_BLOCK_IF_OPERAND_START;
                op_end = current;
                break;

            case TEMPLATE_BLOCK_IF_OPERAND_START:
                if (bc_isspace(c))
                    break;
                if (c >= 'A' && c <= 'Z') {
                    state = TEMPLATE_BLOCK_IF_VARIABLE_OPERAND;
                    start2 = current;
                    break;
                }
                if (c == '"') {
                    state = TEMPLATE_BLOCK_IF_STRING_OPERAND;
                    start2 = current;
                    break;
                }
                op_start = 0;
                op_end = 0;
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid 'if' operand. Must be double-quoted static "
                    "string or variable.");
                break;

            case TEMPLATE_BLOCK_IF_STRING_OPERAND:
                if (c != '"')
                    break;
                if (c == '"' && src[current - 1] == '\\')
                    break;
                state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                end2 = current + 1;
                break;

           case TEMPLATE_BLOCK_IF_VARIABLE_OPERAND:
                if ((c >= 'A' && c <= 'Z') || (c >= '0' && c <= '9') || c == '_')
                    break;
                state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                end2 = current;
                break;

            case TEMPLATE_BLOCK_FOREACH_START:
                if (bc_isspace(c))
                    break;
                if (c >= 'A' && c <= 'Z') {
                    state = TEMPLATE_BLOCK_FOREACH_VARIABLE;
                    start = current;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid foreach variable name. Must begin with uppercase "
                    "letter.");
                break;

            case TEMPLATE_BLOCK_FOREACH_VARIABLE:
                if ((c >= 'A' && c <= 'Z') || (c >= '0' && c <= '9') || c == '_')
                    break;
                if (bc_isspace(c)) {
                    end = current;
                    state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid foreach variable name. Must be uppercase letter, "
                    "number or '_'.");
                break;

            case TEMPLATE_BLOCK_END_WHITESPACE_CLEANER:
                if (bc_isspace(c))
                    break;
                if (c == '-') {
                    lstrip_next = true;
                    state = TEMPLATE_BLOCK_END;
                    break;
                }
                state = TEMPLATE_BLOCK_END;

            case TEMPLATE_BLOCK_END:
                if (c == '%') {
                    state = TEMPLATE_CLOSE_BRACKET;
                    break;
                }
                if (c == '-') {
                    *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                        src_len, current,
                        "Invalid statement syntax. Duplicated whitespace "
                        "cleaner after statement.");
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid statement syntax. Must end with '%%}'.");
                break;

            case TEMPLATE_VARIABLE_START:
                if (bc_isspace(c))
                    break;
                if (c >= 'A' && c <= 'Z') {
                    state = TEMPLATE_VARIABLE;
                    type = BLOGC_TEMPLATE_NODE_VARIABLE;
                    start = current;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid variable name. Must begin with uppercase letter.");
                break;

            case TEMPLATE_VARIABLE:
                if ((c >= 'A' && c <= 'Z') || (c >= '0' && c <= '9') || c == '_')
                    break;
                if (bc_isspace(c)) {
                    end = current;
                    state = TEMPLATE_VARIABLE_END;
                    break;
                }
                if (c == '}') {
                    end = current;
                    state = TEMPLATE_CLOSE_BRACKET;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid variable name. Must be uppercase letter, number "
                    "or '_'.");
                break;

            case TEMPLATE_VARIABLE_END:
                if (bc_isspace(c))
                    break;
                if (c == '}') {
                    state = TEMPLATE_CLOSE_BRACKET;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid statement syntax. Must end with '}}'.");
                break;

            case TEMPLATE_CLOSE_BRACKET:
                if (c == '}') {
                    tmp_op = 0;
                    if (op_end > op_start) {
                        if (op_end - op_start == 1) {
                            if (0 == strncmp("<", src + op_start, 1))
                                tmp_op = BLOGC_TEMPLATE_OP_LT;
                            else if (0 == strncmp(">", src + op_start, 1))
                                tmp_op = BLOGC_TEMPLATE_OP_GT;
                        }
                        else if (op_end - op_start == 2) {
                            if (0 == strncmp("<=", src + op_start, 2))
                                tmp_op = BLOGC_TEMPLATE_OP_LT | BLOGC_TEMPLATE_OP_EQ;
                            else if (0 == strncmp(">=", src + op_start, 2))
                                tmp_op = BLOGC_TEMPLATE_OP_GT | BLOGC_TEMPLATE_OP_EQ;
                            else if (0 == strncmp("==", src + op_start, 2))
                                tmp_op = BLOGC_TEMPLATE_OP_EQ;
                            else if (0 == strncmp("!=", src + op_start, 2))
                                tmp_op = BLOGC_TEMPLATE_OP_NEQ;
                        }
                        if (tmp_op == 0) {
                            *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,
                                src, src_len, op_start,
                                "Invalid 'if' operator. Must be '<', '>', "
                                "'<=', '>=', '==' or '!='.");
                            op_start = 0;
                            op_end = 0;
                            break;
                        }
                        op_start = 0;
                        op_end = 0;
                    }
                    node = bc_malloc(sizeof(blogc_template_node_t));
                    node->type = type;
                    node->op = tmp_op;
                    node->data[0] = NULL;
                    node->data[1] = NULL;
                    if (end > start)
                        node->data[0] = bc_strndup(src + start, end - start);
                    if (end2 > start2) {
                        node->data[1] = bc_strndup(src + start2, end2 - start2);
                        start2 = 0;
                        end2 = 0;
                    }
                    if (type == BLOGC_TEMPLATE_NODE_BLOCK)
                        block_type = node->data[0];
                    ast = bc_slist_append(ast, node);
                    previous = node;
                    node = NULL;
                    state = TEMPLATE_START;
                    type = BLOGC_TEMPLATE_NODE_CONTENT;
                    start = current + 1;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid statement syntax. Must end with '}'.");
                break;

        }

        if (*err != NULL)
            break;

        current++;
    }

    if (*err == NULL) {
        if (state == TEMPLATE_BLOCK_IF_STRING_OPERAND)
            *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src, src_len,
                start2, "Found an open double-quoted string.");
        else if (if_count != 0)
            *err = bc_error_new_printf(BLOGC_ERROR_TEMPLATE_PARSER,
                "%d open 'if', 'ifdef' and/or 'ifndef' statements were not closed!",
                if_count);
        else if (block_open)
            *err = bc_error_new(BLOGC_ERROR_TEMPLATE_PARSER,
                "An open block was not closed!");
        else if (foreach_open)
            *err = bc_error_new(BLOGC_ERROR_TEMPLATE_PARSER,
                "An open 'foreach' statement was not closed!");
    }

    if (*err != NULL) {
        if (node != NULL) {
            free(node->data[0]);
            free(node);
        }
        blogc_template_free_ast(ast);
        return NULL;
    }

    return ast;
}